

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *pObj,int fThisIsPivot)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  int local_2c;
  Abc_Obj_t *pAStack_28;
  int i;
  Abc_Obj_t *pPivot;
  Abc_Obj_t *pNext;
  int fThisIsPivot_local;
  Abc_Obj_t *pObj_local;
  
  pAStack_28 = (Abc_Obj_t *)0x0;
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar2 = Abc_ObjIsPo(pObj);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjIsNode(pObj);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                      ,0xa51,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
      }
      if (fThisIsPivot != 0) {
        Abc_NtkTopoSetBeg(pObj);
      }
      for (local_2c = 0; iVar2 = Abc_ObjFanoutNum(pObj), local_2c < iVar2; local_2c = local_2c + 1)
      {
        pAVar4 = Abc_ObjFanout(pObj,local_2c);
        iVar2 = Abc_NtkTopoHasBeg(pAVar4);
        if (iVar2 == 0) {
          iVar2 = Abc_NtkTopoHasEnd(pAVar4);
          if (iVar2 != 0) {
            __assert_fail("!Abc_NtkTopoHasEnd(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0xa59,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
          }
          Abc_NtkReverseTopoOrder_rec(pAVar4,1);
          pAStack_28 = pAVar4;
          break;
        }
      }
      for (local_2c = 0; iVar2 = Abc_ObjFanoutNum(pObj), local_2c < iVar2; local_2c = local_2c + 1)
      {
        pAVar4 = Abc_ObjFanout(pObj,local_2c);
        if (pAVar4 != pAStack_28) {
          Abc_NtkReverseTopoOrder_rec(pAVar4,0);
        }
      }
      if (fThisIsPivot != 0) {
        Abc_NtkTopoSetEnd(pObj);
      }
      pVVar1 = pObj->pNtk->vTopo;
      uVar3 = Abc_ObjId(pObj);
      Vec_IntPush(pVVar1,uVar3);
    }
    else {
      pVVar1 = pObj->pNtk->vTopo;
      uVar3 = Abc_ObjId(pObj);
      Vec_IntPush(pVVar1,uVar3);
    }
  }
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder_rec( Abc_Obj_t * pObj, int fThisIsPivot )
{
    Abc_Obj_t * pNext, * pPivot = NULL;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsPo(pObj) )
    {
        Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // mark begining
    if ( fThisIsPivot )
        Abc_NtkTopoSetBeg( pObj );        
    // find fanout without topo
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( !Abc_NtkTopoHasBeg(pNext) )
        { 
            assert( !Abc_NtkTopoHasEnd(pNext) );
            Abc_NtkReverseTopoOrder_rec( pNext, 1 );
            pPivot = pNext;
            break;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext != pPivot )
            Abc_NtkReverseTopoOrder_rec( pNext, 0 );
    // mark end
    if ( fThisIsPivot )
        Abc_NtkTopoSetEnd( pObj );
    // save current node        
    Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
}